

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

bool icu_63::number::impl::blueprint_helpers::parseExponentWidthOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *param_3)

{
  char16_t cVar1;
  int32_t iVar2;
  int index;
  int minExponentDigits;
  Notation NVar3;
  
  index = 0;
  cVar1 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar1 == L'+') {
    do {
      minExponentDigits = index;
      index = minExponentDigits + 1;
      iVar2 = numparse::impl::StringSegment::length(segment);
      if (iVar2 <= index) break;
      cVar1 = numparse::impl::StringSegment::charAt(segment,index);
    } while (cVar1 == L'e');
    iVar2 = numparse::impl::StringSegment::length(segment);
    if (index < iVar2) {
      index = 0;
    }
    else {
      NVar3 = (Notation)
              ScientificNotation::withMinExponentDigits
                        ((ScientificNotation *)&macros->notation,minExponentDigits);
      macros->notation = NVar3;
      index = 1;
    }
  }
  return SUB41(index,0);
}

Assistant:

bool blueprint_helpers::parseExponentWidthOption(const StringSegment& segment, MacroProps& macros,
                                                 UErrorCode&) {
    if (segment.charAt(0) != u'+') {
        return false;
    }
    int32_t offset = 1;
    int32_t minExp = 0;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'e') {
            minExp++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        return false;
    }
    // Use the public APIs to enforce bounds checking
    macros.notation = static_cast<ScientificNotation&>(macros.notation).withMinExponentDigits(minExp);
    return true;
}